

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall
RuntimeObjectSystem::OnFileChange(RuntimeObjectSystem *this,IAUDynArray<const_char_*> *filelist)

{
  ICompilerLogger *pIVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  Path *pPVar6;
  iterator iVar7;
  iterator __last;
  char **ppcVar8;
  pointer ppVar9;
  reference ppVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
  pVar11;
  undefined1 local_160 [8];
  FileToBuild fileToBuildFromIncludes;
  TFileToFilesIterator it2;
  TFileToFilesEqualRange range;
  FileToBuild fileToBuild2;
  _Self local_e0;
  TFileToFilesIterator itrCurr;
  bool bForceIncludeDependencies;
  bool bFindIncludeDependencies;
  Path local_a8;
  undefined1 local_80 [8];
  FileToBuild fileToBuild;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  local_38;
  iterator it;
  size_t i;
  vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *pBuildFileList;
  unsigned_short proj;
  IAUDynArray<const_char_*> *filelist_local;
  RuntimeObjectSystem *this_local;
  
  if ((this->m_bAutoCompile & 1U) != 0) {
    for (pBuildFileList._6_2_ = 0;
        sVar4 = std::
                vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                ::size(&this->m_Projects), pBuildFileList._6_2_ < sVar4;
        pBuildFileList._6_2_ = pBuildFileList._6_2_ + 1) {
      pvVar5 = std::
               vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
      i = (size_t)&pvVar5->m_BuildFileList;
      if ((this->m_bCompiling & 1U) != 0) {
        pvVar5 = std::
                 vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
        i = (size_t)&pvVar5->m_PendingBuildFileList;
      }
      if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
        (**(code **)(*(long *)this->m_pCompilerLogger + 0x10))
                  (this->m_pCompilerLogger,
                   "FileChangeNotifier triggered recompile with changes to:\n");
      }
      for (it._M_current = (Path *)0x0; iVar7._M_current = it._M_current,
          pPVar6 = (Path *)IAUDynArray<const_char_*>::Size(filelist), iVar7._M_current < pPVar6;
          it._M_current = (Path *)((long)&(it._M_current)->_vptr_Path + 1)) {
        pvVar5 = std::
                 vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
        iVar7 = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::begin
                          (&pvVar5->m_RuntimeFileList);
        pvVar5 = std::
                 vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
        __last = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::end
                           (&pvVar5->m_RuntimeFileList);
        ppcVar8 = IAUDynArray<const_char_*>::operator[](filelist,(size_t)it._M_current);
        local_38 = std::
                   find<__gnu_cxx::__normal_iterator<FileSystemUtils::Path*,std::vector<FileSystemUtils::Path,std::allocator<FileSystemUtils::Path>>>,char_const*>
                             (iVar7._M_current,__last._M_current,ppcVar8);
        pvVar5 = std::
                 vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
        fileToBuild._40_8_ =
             std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::end
                       (&pvVar5->m_RuntimeFileList);
        bVar2 = __gnu_cxx::operator==
                          (&local_38,
                           (__normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
                            *)&fileToBuild.forceCompile);
        if (!bVar2) {
          if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
            pIVar1 = this->m_pCompilerLogger;
            ppcVar8 = IAUDynArray<const_char_*>::operator[](filelist,(size_t)it._M_current);
            (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"    File %s\n",*ppcVar8);
          }
          ppcVar8 = IAUDynArray<const_char_*>::operator[](filelist,(size_t)it._M_current);
          FileSystemUtils::Path::Path(&local_a8,*ppcVar8);
          BuildTool::FileToBuild::FileToBuild((FileToBuild *)local_80,&local_a8);
          FileSystemUtils::Path::~Path(&local_a8);
          bVar2 = true;
          FileSystemUtils::Path::Extension_abi_cxx11_((string *)&itrCurr,(Path *)local_80);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&itrCurr,".h");
          std::__cxx11::string::~string((string *)&itrCurr);
          if (bVar3) {
            bVar2 = false;
            std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::push_back
                      ((vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *)i,
                       (value_type *)local_80);
            pvVar5 = std::
                     vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
            local_e0._M_node =
                 (_Base_ptr)
                 std::
                 multimap<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                 ::begin(&pvVar5->m_RuntimeSourceDependencyMap);
            while( true ) {
              pvVar5 = std::
                       vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                       ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
              fileToBuild2._40_8_ =
                   std::
                   multimap<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                   ::end(&pvVar5->m_RuntimeSourceDependencyMap);
              bVar3 = std::operator!=(&local_e0,(_Self *)&fileToBuild2.forceCompile);
              if (!bVar3) break;
              ppVar9 = std::
                       _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                       ::operator->(&local_e0);
              bVar3 = FileSystemUtils::operator==(&ppVar9->second,(Path *)local_80);
              if (bVar3) {
                ppVar9 = std::
                         _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                         ::operator->(&local_e0);
                BuildTool::FileToBuild::FileToBuild((FileToBuild *)&range.second,&ppVar9->first);
                std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
                push_back((vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *
                          )i,(value_type *)&range.second);
                BuildTool::FileToBuild::~FileToBuild((FileToBuild *)&range.second);
              }
              std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
              ::operator++(&local_e0);
            }
          }
          if (bVar2) {
            pvVar5 = std::
                     vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ::operator[](&this->m_Projects,(ulong)pBuildFileList._6_2_);
            pVar11 = std::
                     multimap<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                     ::equal_range(&pvVar5->m_RuntimeIncludeMap,(key_type *)local_80);
            while( true ) {
              range.first = pVar11.second._M_node;
              fileToBuildFromIncludes._40_8_ = pVar11.first._M_node;
              bVar2 = std::operator!=((_Self *)&fileToBuildFromIncludes.forceCompile,&range.first);
              if (!bVar2) break;
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                        ::operator*((_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                                     *)&fileToBuildFromIncludes.forceCompile);
              BuildTool::FileToBuild::FileToBuild((FileToBuild *)local_160,&ppVar10->second,true);
              std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
              push_back((vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *)i
                        ,(value_type *)local_160);
              BuildTool::FileToBuild::~FileToBuild((FileToBuild *)local_160);
              std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                            *)&fileToBuildFromIncludes.forceCompile);
              pVar11.second._M_node = range.first._M_node;
              pVar11.first._M_node = (_Base_ptr)fileToBuildFromIncludes._40_8_;
            }
          }
          BuildTool::FileToBuild::~FileToBuild((FileToBuild *)local_80);
        }
      }
    }
    if ((this->m_bCompiling & 1U) == 0) {
      StartRecompile(this);
    }
  }
  return;
}

Assistant:

void RuntimeObjectSystem::OnFileChange(const IAUDynArray<const char*>& filelist)
{
	if( !m_bAutoCompile )
	{
		return;
	}

    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {

        std::vector<BuildTool::FileToBuild>* pBuildFileList = &m_Projects[ proj ].m_BuildFileList;
        if( m_bCompiling )
        {
            pBuildFileList = &m_Projects[ proj ].m_PendingBuildFileList;
        }


        if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "FileChangeNotifier triggered recompile with changes to:\n" ); }
        for( size_t i = 0; i < filelist.Size(); ++i )
        {
            // check this file is in our project list
            TFileList::iterator it = std::find( m_Projects[ proj ].m_RuntimeFileList.begin( ), m_Projects[ proj ].m_RuntimeFileList.end( ), filelist[i] );
            if( it == m_Projects[ proj ].m_RuntimeFileList.end() )
            {
                continue;
            }

            if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "    File %s\n", filelist[ i ] ); }
            BuildTool::FileToBuild fileToBuild( filelist[ i ] );

            bool bFindIncludeDependencies = true;  // if this is a header or a source dependency need to find include dependencies
            bool bForceIncludeDependencies = true;
            if( fileToBuild.filePath.Extension() != ".h" ) //TODO: change to check for .cpp and .c as could have .inc files etc.?
            {
                bFindIncludeDependencies = false;
                pBuildFileList->push_back( fileToBuild );

                // file may be a source dependency, check
                TFileToFilesIterator itrCurr = m_Projects[ proj ].m_RuntimeSourceDependencyMap.begin( );
                while( itrCurr != m_Projects[ proj ].m_RuntimeSourceDependencyMap.end( ) )
                {
                    if( itrCurr->second == fileToBuild.filePath )
                    {
                        BuildTool::FileToBuild fileToBuild2( itrCurr->first );
                        pBuildFileList->push_back( fileToBuild2 );
                    }
                    ++itrCurr;
                }
           }

            if( bFindIncludeDependencies )
            {
                TFileToFilesEqualRange range = m_Projects[ proj ].m_RuntimeIncludeMap.equal_range( fileToBuild.filePath );
                for( TFileToFilesIterator it2 = range.first; it2 != range.second; ++it2 )
                {
                    BuildTool::FileToBuild fileToBuildFromIncludes( ( *it2 ).second, bForceIncludeDependencies );
                    pBuildFileList->push_back( fileToBuildFromIncludes );
                }
            }
        }
    }

	if( !m_bCompiling )
	{
		StartRecompile();
	}
}